

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParsePrefixExpTail
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp,
          PrefixExpType *type)

{
  TokenDetail *pTVar1;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_RCX;
  ParserImpl *in_RDX;
  tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_00000010;
  ParserImpl *in_stack_00000018;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_00000040;
  ParserImpl *in_stack_00000048;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff48;
  ParserImpl *in_stack_ffffffffffffff50;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff60;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_01;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_58;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_50 [5];
  PrefixExpType *in_stack_ffffffffffffffd8;
  
  pTVar1 = LookAhead(in_stack_ffffffffffffff50);
  if ((pTVar1->token_ == 0x5b) ||
     (pTVar1 = LookAhead(in_stack_ffffffffffffff50), pTVar1->token_ == 0x2e)) {
    if (in_RCX != (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)0x0) {
      *(undefined4 *)
       &(in_RCX->_M_t).
        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl = 1;
    }
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ParseVar(in_stack_00000048,in_stack_00000040);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ParsePrefixExpTail(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
           in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
           .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  pTVar1 = LookAhead(in_stack_ffffffffffffff50);
  if ((pTVar1->token_ != 0x3a) &&
     (((pTVar1 = LookAhead(in_stack_ffffffffffffff50), pTVar1->token_ != 0x28 &&
       (pTVar1 = LookAhead(in_stack_ffffffffffffff50), pTVar1->token_ != 0x7b)) &&
      (pTVar1 = LookAhead(in_stack_ffffffffffffff50), pTVar1->token_ != 0x116)))) {
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
           in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
           .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  if (in_RCX != (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)0x0) {
    *(undefined4 *)
     &(in_RCX->_M_t).super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
      ._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl = 2;
  }
  this_01 = &local_58;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  ParseFunctionCall(in_stack_00000018,in_stack_00000010);
  this_00 = local_50;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
            (this_00,in_stack_ffffffffffffff48);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_01);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_01);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            (this_00,in_stack_ffffffffffffff48);
  ParsePrefixExpTail(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_01);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParsePrefixExpTail(std::unique_ptr<SyntaxTree> exp,
                                                       PrefixExpType *type)
        {
            if (LookAhead().token_ == '[' || LookAhead().token_ == '.')
            {
                if (type) *type = PrefixExpType_Var;
                exp = ParseVar(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else if (LookAhead().token_ == ':' || LookAhead().token_ == '(' ||
                     LookAhead().token_ == '{' || LookAhead().token_ == Token_String)
            {
                if (type) *type = PrefixExpType_Functioncall;
                exp = ParseFunctionCall(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else
            {
                return exp;
            }
        }